

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

void __thiscall
aeron::ClientConductor::releaseSubscription
          (ClientConductor *this,int64_t registrationId,ImageList *imageList)

{
  recursive_mutex *__mutex;
  pointer pSVar1;
  pointer pSVar2;
  Image *pIVar3;
  int iVar4;
  pthread_mutex_t *in_RAX;
  longlong now;
  undefined8 uVar5;
  pointer pSVar6;
  ulong uVar7;
  long lVar8;
  iterator __position;
  pthread_mutex_t *local_38;
  
  verifyDriverIsActiveViaErrorHandler(this);
  __mutex = &this->m_adminLock;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  local_38 = in_RAX;
  if (iVar4 != 0) {
LAB_00160e01:
    std::__throw_system_error(iVar4);
    goto LAB_00160e08;
  }
  pSVar1 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = ((long)pSVar2 - (long)pSVar1 >> 6) * -0x5555555555555555 >> 2;
  pSVar6 = pSVar1;
  if (0 < lVar8) {
    pSVar6 = pSVar1 + lVar8 * 4;
    lVar8 = lVar8 + 1;
    __position._M_current = pSVar1 + 2;
    do {
      if (__position._M_current[-2].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + -2;
        goto LAB_00160cff;
      }
      if (__position._M_current[-1].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + -1;
        goto LAB_00160cff;
      }
      if ((__position._M_current)->m_registrationId == registrationId) goto LAB_00160cff;
      if (__position._M_current[1].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + 1;
        goto LAB_00160cff;
      }
      lVar8 = lVar8 + -1;
      __position._M_current = __position._M_current + 4;
    } while (1 < lVar8);
  }
  lVar8 = ((long)pSVar2 - (long)pSVar6 >> 6) * -0x5555555555555555;
  if (lVar8 == 1) {
LAB_00160cd9:
    __position._M_current = pSVar6;
    if (pSVar6->m_registrationId != registrationId) {
      __position._M_current = pSVar2;
    }
  }
  else if (lVar8 == 2) {
LAB_00160ccc:
    __position._M_current = pSVar6;
    if (pSVar6->m_registrationId != registrationId) {
      pSVar6 = pSVar6 + 1;
      goto LAB_00160cd9;
    }
  }
  else {
    __position._M_current = pSVar2;
    if ((lVar8 == 3) && (__position._M_current = pSVar6, pSVar6->m_registrationId != registrationId)
       ) {
      pSVar6 = pSVar6 + 1;
      goto LAB_00160ccc;
    }
  }
LAB_00160cff:
  if (__position._M_current == pSVar2) {
    if (imageList != (ImageList *)0x0) {
      pIVar3 = imageList->m_images;
      if (pIVar3 != (Image *)0x0) {
        if (*(long *)&pIVar3[-1].m_positionBitsToShift != 0) {
          lVar8 = *(long *)&pIVar3[-1].m_positionBitsToShift * 0x128;
          do {
            Image::~Image((Image *)((long)pIVar3[-1].m_termBuffers._M_elems + lVar8 + -8));
            lVar8 = lVar8 + -0x128;
          } while (lVar8 != 0);
        }
        operator_delete__(&pIVar3[-1].m_positionBitsToShift);
      }
      operator_delete(imageList);
    }
  }
  else {
    DriverProxy::removeSubscription(this->m_driverProxy,(__position._M_current)->m_registrationId);
    local_38 = (pthread_mutex_t *)__mutex;
    if (imageList->m_length != 0) {
      lVar8 = 0;
      uVar7 = 0;
      do {
        if (((__position._M_current)->m_onUnavailableImageHandler).super__Function_base._M_manager
            == (_Manager_type)0x0) {
          iVar4 = std::__throw_bad_function_call();
          goto LAB_00160e01;
        }
        (*((__position._M_current)->m_onUnavailableImageHandler)._M_invoker)
                  ((_Any_data *)&(__position._M_current)->m_onUnavailableImageHandler,
                   (Image *)((long)(imageList->m_images->m_termBuffers)._M_elems + lVar8 + -8));
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x128;
      } while (uVar7 < imageList->m_length);
    }
    std::
    vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
    ::_M_erase(&this->m_subscriptions,__position);
    if ((this->m_epochClock).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00160e08:
      uVar5 = std::__throw_bad_function_call();
      pthread_mutex_unlock(local_38);
      _Unwind_Resume(uVar5);
    }
    now = (*(this->m_epochClock)._M_invoker)((_Any_data *)&this->m_epochClock);
    lingerAllResources(this,now,imageList);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void ClientConductor::releaseSubscription(std::int64_t registrationId, struct ImageList *imageList)
{
    verifyDriverIsActiveViaErrorHandler();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [registrationId](const SubscriptionStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it != m_subscriptions.end())
    {
        m_driverProxy.removeSubscription((*it).m_registrationId);

        for (std::size_t i = 0; i < imageList->m_length; i++)
        {
            (*it).m_onUnavailableImageHandler(imageList->m_images[i]);
        }

        m_subscriptions.erase(it);

        lingerAllResources(m_epochClock(), imageList);
    }
    else if (nullptr != imageList)
    {
        delete[] imageList->m_images;
        delete imageList;
    }
}